

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,Allocator *_allocator)

{
  long lVar1;
  int i;
  long lVar2;
  
  if (this->d * this->h * this->w * this->c == _w) {
    if ((this->dims < 3) || (this->cstep == (long)this->h * (long)this->w * (long)this->d)) {
      Mat(__return_storage_ptr__,this);
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->d = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_w;
    }
    else {
      __return_storage_ptr__->cstep = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->d = 0;
      __return_storage_ptr__->c = 0;
      create(__return_storage_ptr__,_w,this->elemsize,this->elempack,_allocator);
      for (lVar2 = 0; lVar2 < this->c; lVar2 = lVar2 + 1) {
        lVar1 = this->elemsize * lVar2;
        memcpy((void *)((long)this->w * (long)this->h * lVar1 * (long)this->d +
                       (long)__return_storage_ptr__->data),
               (void *)(this->cstep * lVar1 + (long)this->data),
               (long)this->h * (long)this->d * this->elemsize * (long)this->w);
      }
    }
  }
  else {
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::reshape(int _w, Allocator* _allocator) const
{
    if (w * h * d * c != _w)
        return Mat();

    if (dims >= 3 && cstep != (size_t)w * h * d)
    {
        Mat m;
        m.create(_w, elemsize, elempack, _allocator);

        // flatten
        for (int i = 0; i < c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + (size_t)i * w * h * d * elemsize;
            memcpy(mptr, ptr, (size_t)w * h * d * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.d = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}